

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Tools.hpp
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
 unicpp::codepoint_to_utf16<std::back_insert_iterator<std::__cxx11::u16string>>
           (char32_t codepoint,
           back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
           output)

{
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  *pbVar1;
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_48;
  value_type local_3a;
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_38;
  value_type local_2e;
  uint local_2c;
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  bStack_28;
  char32_t u;
  value_type local_1e;
  char32_t local_1c;
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  bStack_18;
  char32_t codepoint_local;
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  output_local;
  
  local_1c = codepoint;
  bStack_18.container = output.container;
  if ((uint)codepoint < 0x10000) {
    local_1e = (value_type)codepoint;
    bStack_28 = std::
                back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                ::operator++(&stack0xffffffffffffffe8,0);
    pbVar1 = std::
             back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
             ::operator*(&stack0xffffffffffffffd8);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
    ::operator=(pbVar1,&local_1e);
  }
  else {
    local_2c = codepoint + L'\xffff0000';
    local_2e = (ushort)(local_2c >> 10) & 0x3ff | 0xd800;
    local_38 = std::
               back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
               ::operator++(&stack0xffffffffffffffe8,0);
    pbVar1 = std::
             back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
             ::operator*(&local_38);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
    ::operator=(pbVar1,&local_2e);
    local_3a = (ushort)local_2c & 0x3ff | 0xdc00;
    local_48 = std::
               back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
               ::operator++(&stack0xffffffffffffffe8,0);
    pbVar1 = std::
             back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
             ::operator*(&local_48);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
    ::operator=(pbVar1,&local_3a);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
          )bStack_18.container;
}

Assistant:

OutputIterator codepoint_to_utf16(char32_t codepoint, OutputIterator output)
{
    if(codepoint < 0x10000)
    {
        *(output++) = static_cast<char16_t>(codepoint);
    }
    else
    {
        char32_t u = codepoint - 0x10000;
        *(output++) = 0xD800 | (static_cast<char16_t>(u >> 10) & 0x3FF);
        *(output++) = 0xDC00 | (static_cast<char16_t>(u) & 0x3FF);
    }

    return output;
}